

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O2

uint16_t FACTCue_GetVariableIndex(FACTCue *pCue,char *szFriendlyName)

{
  int iVar1;
  FACTAudioEngine *pFVar2;
  uint16_t uVar3;
  ulong uVar4;
  long lVar5;
  
  if (pCue == (FACTCue *)0x0) {
    uVar3 = 0xffff;
  }
  else {
    FAudio_PlatformLockMutex(pCue->parentBank->parentEngine->apiLock);
    lVar5 = 0;
    uVar4 = 0;
    while( true ) {
      pFVar2 = pCue->parentBank->parentEngine;
      if (pFVar2->variableCount <= uVar4) break;
      iVar1 = SDL_strcmp(szFriendlyName,pFVar2->variableNames[uVar4]);
      if ((iVar1 == 0) &&
         (pFVar2 = pCue->parentBank->parentEngine,
         ((&pFVar2->variables->accessibility)[lVar5] & 4) != 0)) goto LAB_0010cb4f;
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x10;
    }
    uVar4 = 0xffff;
LAB_0010cb4f:
    uVar3 = (uint16_t)uVar4;
    FAudio_PlatformUnlockMutex(pFVar2->apiLock);
  }
  return uVar3;
}

Assistant:

uint16_t FACTCue_GetVariableIndex(
	FACTCue *pCue,
	const char *szFriendlyName
) {
	uint16_t i;
	if (pCue == NULL)
	{
		return FACTVARIABLEINDEX_INVALID;
	}
	FAudio_PlatformLockMutex(pCue->parentBank->parentEngine->apiLock);
	for (i = 0; i < pCue->parentBank->parentEngine->variableCount; i += 1)
	{
		if (	FAudio_strcmp(szFriendlyName, pCue->parentBank->parentEngine->variableNames[i]) == 0 &&
			pCue->parentBank->parentEngine->variables[i].accessibility & 0x04	)
		{
			FAudio_PlatformUnlockMutex(
				pCue->parentBank->parentEngine->apiLock
			);
			return i;
		}
	}
	FAudio_PlatformUnlockMutex(pCue->parentBank->parentEngine->apiLock);
	return FACTVARIABLEINDEX_INVALID;
}